

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_buffer.c
# Opt level: O3

void test_cio_write_buffer_split_and_append(void)

{
  long *****ppppplVar1;
  long ***ppplVar2;
  long ***ppplVar3;
  long ***__ptr;
  long ****__ptr_00;
  bool bVar4;
  int iVar5;
  int iVar6;
  long *****ppppplVar7;
  long ****pppplVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  long ****pppplVar13;
  undefined8 uVar14;
  bool bVar15;
  char buf [100];
  long ***local_e8;
  long ****local_e0;
  long local_d8;
  long lStack_d0;
  ulong local_c8;
  long ****local_c0;
  long ****local_b8;
  undefined1 local_b0 [16];
  int local_9c;
  char local_98 [104];
  
  iVar6 = 1;
  local_c8 = 0;
  do {
    local_d8 = 0;
    lStack_d0 = 0;
    uVar12 = 0;
    local_e8 = (long ***)&local_e8;
    local_e0 = &local_e8;
    do {
      ppppplVar7 = (long *****)malloc(0x20);
      if (ppppplVar7 == (long *****)0x0) {
        UnityFail("allocation of writebuffer element failed!",0x11d);
      }
      pppplVar8 = (long ****)malloc(100);
      if (pppplVar8 == (long ****)0x0) {
        UnityFail("allocation of writebuffer data element failed!",0x11f);
      }
      iVar5 = snprintf((char *)pppplVar8,99,"SL_BUFFER%u",uVar12);
      if (99 < iVar5) {
        UnityFail("Write buffer for split list not filled correctly!",0x122);
      }
      ppppplVar7[2] = pppplVar8;
      ppppplVar7[3] = (long ****)0x64;
      *ppppplVar7 = &local_e8;
      ppppplVar7[1] = local_e0;
      *local_e0 = (long ***)ppppplVar7;
      local_d8 = local_d8 + 1;
      lStack_d0 = (long)ppppplVar7[3] + lStack_d0;
      uVar11 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar11;
      local_e0 = (long ****)ppppplVar7;
    } while (uVar11 != 6);
    local_b0 = (undefined1  [16])0x0;
    uVar14 = 0;
    bVar4 = true;
    local_c0 = (long ****)&local_c0;
    local_b8 = (long ****)&local_c0;
    local_9c = iVar6;
    do {
      bVar15 = bVar4;
      ppppplVar7 = (long *****)malloc(0x20);
      if (ppppplVar7 == (long *****)0x0) {
        UnityFail("allocation of writebuffer element failed!",0x12d);
      }
      pppplVar8 = (long ****)malloc(100);
      if (pppplVar8 == (long ****)0x0) {
        UnityFail("allocation of writebuffer data element failed!",0x12f);
      }
      iVar6 = snprintf((char *)pppplVar8,99,"AL_BUFFER%u",uVar14);
      uVar12 = local_c8;
      if (99 < iVar6) {
        UnityFail("Write buffer for append list not filled correctly!",0x132);
      }
      ppppplVar7[2] = pppplVar8;
      ppppplVar7[3] = (long ****)0x64;
      *ppppplVar7 = (long ****)&local_c0;
      ppppplVar7[1] = local_b8;
      *local_b8 = (long ***)ppppplVar7;
      iVar6 = local_9c;
      local_b8 = (long ****)ppppplVar7;
      local_b0._0_8_ = local_b0._0_8_ + 1;
      local_b0._8_8_ = (long)ppppplVar7[3] + local_b0._8_8_;
      uVar14 = 1;
      pppplVar8 = &local_e8;
      bVar4 = false;
      iVar5 = local_9c;
    } while (bVar15);
    do {
      pppplVar8 = (long ****)*pppplVar8;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
    if ((long ****)local_e8 != &local_e8) {
      if (&local_e8 == pppplVar8) {
        pppplVar8 = (long ****)local_e8;
      }
      if (pppplVar8 == &local_e8) {
        lVar9 = 0;
        lVar10 = 0;
      }
      else {
        lVar10 = 0;
        lVar9 = 0;
        pppplVar13 = pppplVar8;
        do {
          lVar9 = lVar9 + (long)pppplVar13[3];
          lVar10 = lVar10 + 1;
          pppplVar13 = (long ****)*pppplVar13;
        } while (pppplVar13 != &local_e8);
      }
      ppppplVar1 = (long *****)pppplVar8[1];
      *ppppplVar1 = &local_e8;
      *local_e0 = (long ***)&local_c0;
      local_b8 = local_e0;
      *ppppplVar7 = pppplVar8;
      pppplVar8[1] = (long ***)ppppplVar7;
      local_b0._8_8_ = local_b0._8_8_ + lVar9;
      local_b0._0_8_ = local_b0._0_8_ + lVar10;
      local_e0 = (long ****)ppppplVar1;
      local_d8 = local_d8 - lVar10;
      lStack_d0 = lStack_d0 - lVar9;
    }
    UnityAssertEqualNumber
              (local_c8,local_d8,"Number of elements in splitted list not correct!",0x13f,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (uVar12 * 100,lStack_d0,"Total size of splitted list not correct!",0x140,
               UNITY_DISPLAY_STYLE_INT);
    lVar9 = 8 - uVar12;
    UnityAssertEqualNumber
              (lVar9,local_b0._0_8_,"Number of elements in appended list not correct!",0x141,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (lVar9 * 100,local_b0._8_8_,"Total size of appended list not correct!",0x142,
               UNITY_DISPLAY_STYLE_INT);
    uVar14 = 0;
    ppppplVar7 = (long *****)local_c0;
    bVar4 = true;
    do {
      bVar15 = bVar4;
      iVar5 = snprintf(local_98,100,"AL_BUFFER%u",uVar14);
      if (99 < iVar5) {
        UnityFail("Check buffer for append list not filled correctly!",0x149);
      }
      UnityAssertEqualString
                (local_98,(char *)ppppplVar7[2],"Data in merged append buffer not correct!",0x14b);
      ppppplVar7 = (long *****)*ppppplVar7;
      uVar14 = 1;
      bVar4 = false;
    } while (bVar15);
    uVar12 = local_c8 & 0xffffffff;
    do {
      iVar5 = snprintf(local_98,100,"SL_BUFFER%u",uVar12);
      if (99 < iVar5) {
        UnityFail("Check buffer for split list not filled correctly!",0x152);
      }
      UnityAssertEqualString
                (local_98,(char *)ppppplVar7[2],"Data in merged split buffer not correct!",0x154);
      ppppplVar7 = (long *****)*ppppplVar7;
      uVar11 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar11;
    } while (uVar11 != 6);
    pppplVar8 = (long ****)local_e8;
    if ((long ****)local_e8 != (long ****)0x0 && (long ****)local_e8 != &local_e8) {
      do {
        __ptr = local_e8;
        local_d8 = local_d8 + -1;
        lStack_d0 = lStack_d0 - (long)pppplVar8[3];
        ppplVar2 = *pppplVar8;
        ppplVar3 = pppplVar8[1];
        ppplVar2[1] = (long **)ppplVar3;
        *ppplVar3 = (long **)ppplVar2;
        free(local_e8[2]);
        free(__ptr);
        pppplVar8 = (long ****)0x0;
        if ((long ****)local_e8 != &local_e8) {
          pppplVar8 = (long ****)local_e8;
        }
      } while (pppplVar8 != (long ****)0x0);
    }
    ppppplVar7 = (long *****)local_c0;
    if ((long *****)local_c0 != (long *****)0x0 && (long *****)local_c0 != &local_c0) {
      do {
        __ptr_00 = local_c0;
        local_b0._8_8_ = local_b0._8_8_ - (long)ppppplVar7[3];
        local_b0._0_8_ = local_b0._0_8_ + -1;
        pppplVar8 = *ppppplVar7;
        pppplVar13 = ppppplVar7[1];
        pppplVar8[1] = (long ***)pppplVar13;
        *pppplVar13 = (long ***)pppplVar8;
        free(local_c0[2]);
        free(__ptr_00);
        ppppplVar7 = (long *****)0x0;
        if ((long *****)local_c0 != &local_c0) {
          ppppplVar7 = (long *****)local_c0;
        }
      } while (ppppplVar7 != (long *****)0x0);
    }
    local_c8 = local_c8 + 1;
    iVar6 = iVar6 + 1;
  } while (local_c8 != 6);
  return;
}

Assistant:

static void test_cio_write_buffer_split_and_append(void)
{
	enum { SPLIT_LIST_LENGTH = 6 };
	for (unsigned int split_position = 0; split_position < SPLIT_LIST_LENGTH; split_position++) {
		struct cio_write_buffer wbh_to_split;
		cio_write_buffer_head_init(&wbh_to_split);

		enum { DATA_BUFFER_LENGTH = 100 };
		for (unsigned int i = 0; i < SPLIT_LIST_LENGTH; i++) {
			struct cio_write_buffer *wbe = malloc(sizeof(*wbe));
			TEST_ASSERT_NOT_NULL_MESSAGE(wbe, "allocation of writebuffer element failed!");
			char *data = malloc(DATA_BUFFER_LENGTH);
			TEST_ASSERT_NOT_NULL_MESSAGE(data, "allocation of writebuffer data element failed!");
			int ret = snprintf(data, DATA_BUFFER_LENGTH - 1, "SL_BUFFER%u", i);
			if (ret >= DATA_BUFFER_LENGTH) {
				TEST_FAIL_MESSAGE("Write buffer for split list not filled correctly!");
			}
			cio_write_buffer_element_init(wbe, data, DATA_BUFFER_LENGTH);
			cio_write_buffer_queue_tail(&wbh_to_split, wbe);
		}

		struct cio_write_buffer wbh_to_append;
		cio_write_buffer_head_init(&wbh_to_append);
		enum { APPEND_LIST_LENGTH = 2 };
		for (unsigned int i = 0; i < APPEND_LIST_LENGTH; i++) {
			struct cio_write_buffer *wbe = malloc(sizeof(*wbe));
			TEST_ASSERT_NOT_NULL_MESSAGE(wbe, "allocation of writebuffer element failed!");
			char *data = malloc(DATA_BUFFER_LENGTH);
			TEST_ASSERT_NOT_NULL_MESSAGE(data, "allocation of writebuffer data element failed!");
			int ret = snprintf(data, DATA_BUFFER_LENGTH - 1, "AL_BUFFER%u", i);
			if (ret >= DATA_BUFFER_LENGTH) {
				TEST_FAIL_MESSAGE("Write buffer for append list not filled correctly!");
			}
			cio_write_buffer_element_init(wbe, data, DATA_BUFFER_LENGTH);
			cio_write_buffer_queue_tail(&wbh_to_append, wbe);
		}

		struct cio_write_buffer *e = &wbh_to_split;

		for (unsigned int i = 0; i <= split_position; i++) {
			e = e->next;
		}

		cio_write_buffer_split_and_append(&wbh_to_append, &wbh_to_split, e);
		TEST_ASSERT_EQUAL_MESSAGE(split_position, cio_write_buffer_get_num_buffer_elements(&wbh_to_split), "Number of elements in splitted list not correct!");
		TEST_ASSERT_EQUAL_MESSAGE(split_position * DATA_BUFFER_LENGTH, cio_write_buffer_get_total_size(&wbh_to_split), "Total size of splitted list not correct!");
		TEST_ASSERT_EQUAL_MESSAGE(APPEND_LIST_LENGTH + (SPLIT_LIST_LENGTH - split_position), cio_write_buffer_get_num_buffer_elements(&wbh_to_append), "Number of elements in appended list not correct!");
		TEST_ASSERT_EQUAL_MESSAGE((APPEND_LIST_LENGTH + (SPLIT_LIST_LENGTH - split_position)) * DATA_BUFFER_LENGTH, cio_write_buffer_get_total_size(&wbh_to_append), "Total size of appended list not correct!");

		e = wbh_to_append.next;
		for (unsigned i = 0; i < APPEND_LIST_LENGTH; i++) {
			char buf[DATA_BUFFER_LENGTH];
			int ret = snprintf(buf, sizeof(buf), "AL_BUFFER%u", i);
			if (ret >= DATA_BUFFER_LENGTH) {
				TEST_FAIL_MESSAGE("Check buffer for append list not filled correctly!");
			}
			TEST_ASSERT_EQUAL_STRING_MESSAGE(buf, e->data.element.data, "Data in merged append buffer not correct!");
			e = e->next;
		}
		for (unsigned i = split_position; i < SPLIT_LIST_LENGTH; i++) {
			char buf[DATA_BUFFER_LENGTH];
			int ret = snprintf(buf, sizeof(buf), "SL_BUFFER%u", i);
			if (ret >= DATA_BUFFER_LENGTH) {
				TEST_FAIL_MESSAGE("Check buffer for split list not filled correctly!");
			}
			TEST_ASSERT_EQUAL_STRING_MESSAGE(buf, e->data.element.data, "Data in merged split buffer not correct!");
			e = e->next;
		}

		struct cio_write_buffer *remaining_buffer_in_split_list = cio_write_buffer_queue_dequeue(&wbh_to_split);
		while (remaining_buffer_in_split_list != NULL) {
			free(remaining_buffer_in_split_list->data.element.data);
			free(remaining_buffer_in_split_list);
			remaining_buffer_in_split_list = cio_write_buffer_queue_dequeue(&wbh_to_split);
		}

		struct cio_write_buffer *remaining_buffer_in_append_list = cio_write_buffer_queue_dequeue(&wbh_to_append);
		while (remaining_buffer_in_append_list != NULL) {
			free(remaining_buffer_in_append_list->data.element.data);
			free(remaining_buffer_in_append_list);
			remaining_buffer_in_append_list = cio_write_buffer_queue_dequeue(&wbh_to_append);
		}
	}
}